

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPLYImportExport.cpp
# Opt level: O0

void __thiscall
utPLYImportExport_vertexColorTest_Test::TestBody(utPLYImportExport_vertexColorTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_180;
  Message local_178;
  uint local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_7;
  Message local_150;
  uint local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_6;
  Message local_128;
  uint local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  uint local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  aiFace first_face;
  Message local_c8;
  bool local_ba;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  Message local_a0;
  aiPrimitiveType local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer importer;
  utPLYImportExport_vertexColorTest_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/PLY/float-color.ply"
                        ,0x400);
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_6c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_68,"1u","scene->mMeshes[0]->mNumFaces",&local_6c,
             &(*local_20->mMeshes)->mNumFaces);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_94 = aiPrimitiveType_TRIANGLE;
  testing::internal::EqHelper<false>::Compare<aiPrimitiveType,unsigned_int>
            ((EqHelper<false> *)local_90,"aiPrimitiveType_TRIANGLE",
             "scene->mMeshes[0]->mPrimitiveTypes",&local_94,&(*local_20->mMeshes)->mPrimitiveTypes);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_b9 = true;
  local_ba = aiMesh::HasVertexColors(*local_20->mMeshes,0);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_b8,"true","scene->mMeshes[0]->HasVertexColors(0)",&local_b9,
             &local_ba);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&first_face.mIndices,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&first_face.mIndices,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&first_face.mIndices);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  aiFace::aiFace((aiFace *)&gtest_ar_4.message_,(*local_20->mMeshes)->mFaces);
  local_f4 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_f0,"3u","first_face.mNumIndices",&local_f4,
             (uint *)&gtest_ar_4.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_11c = 0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_int>
            (local_118,"0u",(uint *)"first_face.mIndices[0]",&local_11c,(type *)first_face._0_8_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_144 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_140,"1u","first_face.mIndices[1]",&local_144,
             (uint *)(first_face._0_8_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_16c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_168,"2u","first_face.mIndices[2]",&local_16c,
             (uint *)(first_face._0_8_ + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPLYImportExport.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  aiFace::~aiFace((aiFace *)&gtest_ar_4.message_);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F( utPLYImportExport, vertexColorTest ) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/PLY/float-color.ply", aiProcess_ValidateDataStructure);
    EXPECT_NE( nullptr, scene );
    EXPECT_EQ(1u, scene->mMeshes[0]->mNumFaces);
    EXPECT_EQ(aiPrimitiveType_TRIANGLE, scene->mMeshes[0]->mPrimitiveTypes);
    EXPECT_EQ(true, scene->mMeshes[0]->HasVertexColors(0));

    auto first_face = scene->mMeshes[0]->mFaces[0];
    EXPECT_EQ(3u, first_face.mNumIndices);
    EXPECT_EQ(0u, first_face.mIndices[0]);
    EXPECT_EQ(1u, first_face.mIndices[1]);
    EXPECT_EQ(2u, first_face.mIndices[2]);
}